

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

GCObject ** sweeptolive(lua_State *L,GCObject **p,int *n)

{
  undefined4 local_2c;
  int i;
  GCObject **old;
  int *n_local;
  GCObject **p_local;
  lua_State *L_local;
  
  local_2c = 0;
  n_local = (int *)p;
  do {
    local_2c = local_2c + 1;
    n_local = (int *)sweeplist(L,(GCObject **)n_local,1);
  } while ((GCObject **)n_local == p);
  if (n != (int *)0x0) {
    *n = local_2c + *n;
  }
  return (GCObject **)n_local;
}

Assistant:

static GCObject **sweeptolive (lua_State *L, GCObject **p, int *n) {
  GCObject ** old = p;
  int i = 0;
  do {
    i++;
    p = sweeplist(L, p, 1);
  } while (p == old);
  if (n) *n += i;
  return p;
}